

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testing.c
# Opt level: O3

void output_header(FILE *fp,char *prog)

{
  int iVar1;
  
  iVar1 = fprintf((FILE *)fp,"%-10s%-40s %9s %8s  %8s %8s\n","Benchmark",prog,"ops","time","ops/sec"
                  ,"time/op");
  if (1 < iVar1) {
    iVar1 = iVar1 + -1;
    do {
      putc(0x2d,(FILE *)fp);
      iVar1 = iVar1 + -1;
    } while (iVar1 != 0);
  }
  putc(10,(FILE *)fp);
  fflush((FILE *)fp);
  return;
}

Assistant:

static void output_header (FILE *fp, const char *prog) {
	int i;
	int hdrlen = fprintf (fp, "%-10s%-40s %9s %8s  %8s %8s\n", "Benchmark", prog, "ops", "time",
			      "ops/sec", "time/op");
	for (i = 1; i < hdrlen; i++) {
		putc ('-', fp);
	}
	putc ('\n', fp);
	fflush (fp);
}